

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet<google::protobuf::MessageLite>
          (ExtensionSet *this,char *ptr,MessageLite *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  bool bVar4;
  char *pcVar5;
  Nonnull<const_char_*> failure_msg;
  int iVar6;
  int iVar7;
  uint32_t tag;
  char *local_58;
  uint local_4c;
  ExtensionSet *local_48;
  LogMessageFatal local_40;
  
  local_58 = ptr;
  local_48 = this;
  do {
    while( true ) {
      bVar4 = ParseContext::Done(ctx,&local_58);
      if (bVar4) {
        return local_58;
      }
      local_58 = ReadTag(local_58,&local_4c,0);
      if (local_58 == (char *)0x0) {
        return (char *)0x0;
      }
      if ((ulong)local_4c == 0xb) break;
      if ((local_4c == 0) || ((local_4c & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_4c - 1;
        return local_58;
      }
      local_58 = ParseField(this,(ulong)local_4c,local_58,extendee,metadata,ctx);
      if (local_58 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    iVar7 = ctx->depth_;
    iVar6 = iVar7 + -1;
    ctx->depth_ = iVar6;
    if (iVar7 < 1) {
      return (char *)0x0;
    }
    iVar7 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar7;
    pcVar5 = ParseMessageSetItem(this,local_58,extendee,metadata,ctx);
    if (pcVar5 != (char *)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar6,ctx->depth_,"old_depth == depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x491;
LAB_00285602:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar6,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar7,ctx->group_depth_,"old_group_depth == group_depth_");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        iVar6 = 0x492;
        goto LAB_00285602;
      }
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if (uVar3 != 0xb) {
      return (char *)0x0;
    }
    this = local_48;
    local_58 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, const Msg* extendee,
                              InternalMetadata* metadata,
                              internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        ptr = ctx->ParseGroupInlined(ptr, tag, [&](const char* ptr) {
          return ParseMessageSetItem(ptr, extendee, metadata, ctx);
        });
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      } else {
        if (tag == 0 || (tag & 7) == 4) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = ParseField(tag, ptr, extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    }
    return ptr;
  }